

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_tcp.c
# Opt level: O2

int test_object(void)

{
  int iVar1;
  tnt_stream *s;
  size_t sVar2;
  ssize_t sVar3;
  bool bVar4;
  char acStack_58 [8];
  char str1 [29];
  
  plan(0x66);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_object");
  fputc(10,_stdout);
  s = tnt_object((tnt_stream *)0x0);
  builtin_strncpy(str1 + 8," i can quack",0xd);
  builtin_strncpy(acStack_58,"I\'m tota",8);
  builtin_strncpy(str1,"ly duck,",8);
  sVar2 = strlen(acStack_58);
  iVar1 = __ok((uint)(s != (tnt_stream *)0x0),"Checking that object is allocated");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Checking that object is allocated",0x21,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,99);
  }
  iVar1 = __ok((uint)(s->alloc == 1),"Checking s->alloc");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Checking s->alloc",0x11,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,100);
  }
  sVar3 = tnt_object_add_int(s,0x4bb);
  iVar1 = __ok((uint)(sVar3 == 3),"encoding int > 0");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding int > 0",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x65);
  }
  sVar3 = tnt_object_add_int(s,-0x4bb);
  iVar1 = __ok((uint)(sVar3 == 3),"encoding int < 0");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding int < 0",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x66);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x67);
  }
  sVar3 = tnt_object_add_str(s,acStack_58,(uint32_t)sVar2);
  iVar1 = __ok((uint)(sVar3 == sVar2 + 1),"encoding str");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding str",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x68);
  }
  sVar3 = tnt_object_add_strz(s,acStack_58);
  iVar1 = __ok((uint)(sVar3 == sVar2 + 1),"encoding strz");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding strz",0xd,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x69);
  }
  iVar1 = tnt_object_type(s,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == -1),"Check type set (must fail)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check type set (must fail)",0x1a,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x6b);
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Reset bytestring",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x6d);
  }
  iVar1 = tnt_object_type(s,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check type set (must be ok)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x6e);
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"Sparse array");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Sparse array",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x6f);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x70);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x71);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x72);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x73);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing container");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Closing container",0x11,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x74);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == -1),"Erroneous container close");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Erroneous container close",0x19,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x75);
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Reset bytestring",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x78);
  }
  iVar1 = tnt_object_type(s,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check type set (must be ok)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x79);
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packed array");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Packed array",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7a);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7b);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7c);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7d);
  }
  sVar3 = tnt_object_add_nil(s);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("encoding nil",0xc,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7e);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing container");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Closing container",0x11,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7f);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == -1),"Erroneous container close");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Erroneous container close",0x19,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x80);
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Reset bytestring",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x91);
  }
  iVar1 = tnt_object_type(s,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check type set (must be ok)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x92);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packing map-1");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Packing map-1",0xd,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x93);
  }
  sVar3 = tnt_object_add_strz(s,"menu");
  iVar1 = __ok((uint)(sVar3 == 5),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Packing key (str)",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x94);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"   Packing value (map-2)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("   Packing value (map-2)",0x18,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x95);
  }
  sVar3 = tnt_object_add_strz(s,"popup");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Packing key (str)",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x96);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"   Packing value (map-3)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("   Packing value (map-3)",0x18,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x97);
  }
  sVar3 = tnt_object_add_strz(s,"menuitem");
  iVar1 = __ok((uint)(sVar3 == 9),"     Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("     Packing key (str)",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x98);
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"      Packing value (array)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("      Packing value (array)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x99);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-4)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Packing value (map-4)",0x1d,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9a);
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9b);
  }
  sVar3 = tnt_object_add_strz(s,"CreateNewDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xf),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9c);
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9d);
  }
  sVar3 = tnt_object_add_strz(s,"New");
  iVar1 = __ok((uint)(sVar3 == 4),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9e);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-4");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Closing map-4",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9f);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-5)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Packing value (map-5)",0x1d,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa0);
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa1);
  }
  sVar3 = tnt_object_add_strz(s,"OpenDoc()");
  iVar1 = __ok((uint)(sVar3 == 10),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa2);
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa3);
  }
  sVar3 = tnt_object_add_strz(s,"Open");
  iVar1 = __ok((uint)(sVar3 == 5),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa4);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-5");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Closing map-5",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa5);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-6)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Packing value (map-6)",0x1d,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa6);
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa7);
  }
  sVar3 = tnt_object_add_strz(s,"CloseDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xb),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa8);
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa9);
  }
  sVar3 = tnt_object_add_strz(s,"Close");
  iVar1 = __ok((uint)(sVar3 == 6),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xaa);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-6");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Closing map-6",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xab);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"      Closing map-3");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("      Closing map-3",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xac);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"    Closing array");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("    Closing array",0x11,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xad);
  }
  sVar3 = tnt_object_add_strz(s,"id");
  iVar1 = __ok((uint)(sVar3 == 3),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Packing key (str)",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xae);
  }
  sVar3 = tnt_object_add_strz(s,"file");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("   Packing value (str)",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xaf);
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Packing key (str)",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb0);
  }
  sVar3 = tnt_object_add_strz(s,"File");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("   Packing value (str)",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb1);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"  Closing map-2");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Closing map-2",0xf,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb2);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing map-1");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Closing map-1",0xd,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb3);
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Reset bytestring",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb5);
  }
  iVar1 = tnt_object_type(s,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check type set (must be ok)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb6);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"Packing map-1");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Packing map-1",0xd,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb7);
  }
  sVar3 = tnt_object_add_strz(s,"menu");
  iVar1 = __ok((uint)(sVar3 == 5),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Packing key (str)",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb8);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (map-2)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("   Packing value (map-2)",0x18,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb9);
  }
  sVar3 = tnt_object_add_strz(s,"popup");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Packing key (str)",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xba);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (map-3)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("   Packing value (map-3)",0x18,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbb);
  }
  sVar3 = tnt_object_add_strz(s,"menuitem");
  iVar1 = __ok((uint)(sVar3 == 9),"     Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("     Packing key (str)",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbc);
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"      Packing value (array)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("      Packing value (array)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbd);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-4)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Packing value (map-4)",0x1d,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbe);
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbf);
  }
  sVar3 = tnt_object_add_strz(s,"CreateNewDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xf),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc0);
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc1);
  }
  sVar3 = tnt_object_add_strz(s,"New");
  iVar1 = __ok((uint)(sVar3 == 4),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc2);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-4");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Closing map-4",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc3);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-5)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Packing value (map-5)",0x1d,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc4);
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc5);
  }
  sVar3 = tnt_object_add_strz(s,"OpenDoc()");
  iVar1 = __ok((uint)(sVar3 == 10),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc6);
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,199);
  }
  sVar3 = tnt_object_add_strz(s,"Open");
  iVar1 = __ok((uint)(sVar3 == 5),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,200);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-5");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Closing map-5",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc9);
  }
  sVar3 = tnt_object_add_map(s,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-6)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Packing value (map-6)",0x1d,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xca);
  }
  sVar3 = tnt_object_add_strz(s,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xcb);
  }
  sVar3 = tnt_object_add_strz(s,"CloseDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xb),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xcc);
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("          Packing key (str)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xcd);
  }
  sVar3 = tnt_object_add_strz(s,"Close");
  iVar1 = __ok((uint)(sVar3 == 6),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("           Packing value (str)",0x1e,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xce);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-6");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("        Closing map-6",0x15,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xcf);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"      Closing map-3");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("      Closing map-3",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd0);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"    Closing array");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("    Closing array",0x11,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd1);
  }
  sVar3 = tnt_object_add_strz(s,"id");
  iVar1 = __ok((uint)(sVar3 == 3),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Packing key (str)",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd2);
  }
  sVar3 = tnt_object_add_strz(s,"file");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("   Packing value (str)",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd3);
  }
  sVar3 = tnt_object_add_strz(s,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Packing key (str)",0x13,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd4);
  }
  sVar3 = tnt_object_add_strz(s,"File");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("   Packing value (str)",0x16,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd5);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"  Closing map-2");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("  Closing map-2",0xf,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd6);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing map-1");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Closing map-1",0xd,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd7);
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Reset bytestring",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd9);
  }
  iVar1 = tnt_object_type(s,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Check type set (must be ok)",0x1b,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xda);
  }
  sVar3 = tnt_object_add_array(s,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packing array (size more 1 byte)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Packing array (size more 1 byte)",0x20,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xdb);
  }
  iVar1 = 0x20;
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    tnt_object_add_nil(s);
  }
  sVar3 = tnt_object_container_close(s);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing array (size more 1 byte)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Closing array (size more 1 byte)",0x20,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xdd);
  }
  iVar1 = tnt_object_reset(s);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Reset bytestring",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xdf);
  }
  sVar3 = tnt_object_format(s,"{%s{%s{%s[{%s%s%s%s}{%s%s%s%s}{%s%s%s%s}]}%s%s%s%s}}","menu","popup",
                            "menuitem","onclick","CreateNewDoc()","value","New","onclick",
                            "OpenDoc()","value","Open","onclick","CloseDoc()","value","Close","id",
                            "file","value","File");
  iVar1 = __ok((uint)(sVar3 != -1),"Pack with format");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fwrite("#   Failed test \'",0x11,1,_stderr);
    fwrite("Pack with format",0x10,1,_stderr);
    fwrite("\'\n",2,1,_stderr);
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xe5);
  }
  tnt_stream_free(s);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_object");
  fputc(10,_stdout);
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_object() {
	plan(102);
	header();

	struct tnt_stream *s = NULL; s = tnt_object(NULL);


	char str1[] = "I'm totaly duck, i can quack";
	ssize_t str1_len = strlen(str1);

	isnt(s, NULL, "Checking that object is allocated");
	is  (s->alloc, 1, "Checking s->alloc");
	is  (tnt_object_add_int(s, 1211),  3, "encoding int > 0");
	is  (tnt_object_add_int(s, -1211), 3, "encoding int < 0");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_str(s, str1, str1_len), str1_len + 1, "encoding str");
	is  (tnt_object_add_strz(s, str1), str1_len + 1, "encoding strz");

	is  (tnt_object_type(s, TNT_SBO_SPARSE), -1, "Check type set (must fail)");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_SPARSE), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 5, "Sparse array");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_container_close(s), 0, "Closing container");
	is  (tnt_object_container_close(s), -1, "Erroneous container close");


	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 1, "Packed array");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_container_close(s), 0, "Closing container");
	is  (tnt_object_container_close(s), -1, "Erroneous container close");


	/*
	 * {"menu": {
  	 *    "popup": {
    	 *      "menuitem": [
      	 *        {"value": "New", "onclick": "CreateNewDoc()"},
      	 *        {"value": "Open", "onclick": "OpenDoc()"},
      	 *        {"value": "Close", "onclick": "CloseDoc()"}
    	 *      ]
  	 *    }
	 *    "id": "file",
  	 *    "value": "File",
	 * }}
	 */

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_map(s, 0), 1,			"Packing map-1");
	is  (tnt_object_add_strz(s, "menu"), 5,			"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 1,			"   Packing value (map-2)");
	is  (tnt_object_add_strz(s, "popup"), 6,		"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 1,			"   Packing value (map-3)");
	is  (tnt_object_add_strz(s, "menuitem"), 9,		"     Packing key (str)");
	is  (tnt_object_add_array(s, 0), 1,			"      Packing value (array)");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-4)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CreateNewDoc()"), 15,	"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "New"), 4,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-4");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-5)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "OpenDoc()"), 10,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Open"), 5,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-5");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-6)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CloseDoc()"), 11,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Close"), 6,		"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-6");
	is  (tnt_object_container_close(s), 0,			"      Closing map-3");
	is  (tnt_object_container_close(s), 0,			"    Closing array");
	is  (tnt_object_add_strz(s, "id"), 3,			"  Packing key (str)");
	is  (tnt_object_add_strz(s, "file"), 5,			"   Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"  Packing key (str)");
	is  (tnt_object_add_strz(s, "File"), 5,			"   Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"  Closing map-2");
	is  (tnt_object_container_close(s), 0,			"Closing map-1");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_SPARSE), 0, "Check type set (must be ok)");
	is  (tnt_object_add_map(s, 0), 5,			"Packing map-1");
	is  (tnt_object_add_strz(s, "menu"), 5,			"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 5,			"   Packing value (map-2)");
	is  (tnt_object_add_strz(s, "popup"), 6,		"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 5,			"   Packing value (map-3)");
	is  (tnt_object_add_strz(s, "menuitem"), 9,		"     Packing key (str)");
	is  (tnt_object_add_array(s, 0), 5,			"      Packing value (array)");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-4)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CreateNewDoc()"), 15,	"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "New"), 4,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-4");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-5)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "OpenDoc()"), 10,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Open"), 5,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-5");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-6)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CloseDoc()"), 11,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Close"), 6,		"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-6");
	is  (tnt_object_container_close(s), 0,			"      Closing map-3");
	is  (tnt_object_container_close(s), 0,			"    Closing array");
	is  (tnt_object_add_strz(s, "id"), 3,			"  Packing key (str)");
	is  (tnt_object_add_strz(s, "file"), 5,			"   Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"  Packing key (str)");
	is  (tnt_object_add_strz(s, "File"), 5,			"   Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"  Closing map-2");
	is  (tnt_object_container_close(s), 0,			"Closing map-1");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 1, "Packing array (size more 1 byte)");
	for (int i = 0; i < 32; ++i) tnt_object_add_nil(s);
	is  (tnt_object_container_close(s), 0, "Closing array (size more 1 byte)");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	isnt(tnt_object_format(s, "{%s{%s{%s[{%s%s%s%s}{%s%s%s%s}{%s%s%s%s}]}%s%s%s%s}}",
			       "menu", "popup", "menuitem",
			       "onclick", "CreateNewDoc()", "value", "New",
			       "onclick", "OpenDoc()", "value", "Open",
			       "onclick", "CloseDoc()", "value", "Close",
			       "id", "file", "value", "File"), -1, "Pack with format");

	tnt_stream_free(s);

	footer();
	return check_plan();
}